

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabularDataFile.cpp
# Opt level: O1

TabularDataFile * __thiscall
asl::TabularDataFile::columns(TabularDataFile *this,Array<asl::String> *cols)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  char *pcVar4;
  TextFile *pTVar5;
  String *pSVar6;
  anon_union_16_2_78e7fdac_for_String_2 *paVar7;
  long lVar8;
  ulong uVar9;
  int i;
  char cVar10;
  int iVar11;
  int iVar12;
  String rel;
  Array<asl::String> parts;
  Array<asl::String> parts_1;
  String s_1;
  char local_a1;
  String local_a0;
  String *local_88;
  anon_union_16_2_78e7fdac_for_String_2 local_80;
  Array<asl::String> *local_70;
  String *local_68;
  undefined1 local_60 [24];
  String local_48;
  
  if (this->_separator == '\0') {
    this->_separator = ',';
  }
  local_70 = cols;
  if (*(int *)&(this->_columnNames)._a[-1].field_2 == 0) {
    File::open((File *)this,(char *)&this->_name,9);
    if ((this->_file).super_File._file == (FILE *)0x0) {
      return this;
    }
    lVar8 = (long)*(int *)&local_70->_a[-1].field_2;
    if (0 < lVar8) {
      uVar9 = lVar8 << 0x20;
      do {
        local_a0._size = 0;
        local_a0._len = 1;
        local_a0.field_2._0_2_ = 0x3a;
        String::split((String *)&local_88,local_70->_a + (int)uVar9);
        if (local_a0._size != 0) {
          free((void *)CONCAT53(local_a0.field_2._3_5_,
                                CONCAT12(local_a0.field_2._space[2],local_a0.field_2._0_2_)));
        }
        Array<asl::String>::insert(&this->_columnNames,-1,local_88);
        Array<asl::String>::~Array((Array<asl::String> *)&local_88);
        uVar1 = uVar9 + 1;
        uVar2 = uVar9 >> 0x20;
        uVar9 = uVar9 & 0xffffffff00000000 | uVar1 & 0xffffffff;
      } while ((int)uVar1 < (int)uVar2);
    }
  }
  String::toLowerCase(&local_a0,&this->_name);
  bVar3 = String::endsWith(&local_a0,".arff");
  if (local_a0._size != 0) {
    free((void *)CONCAT53(local_a0.field_2._3_5_,
                          CONCAT12(local_a0.field_2._space[2],local_a0.field_2._0_2_)));
  }
  if (bVar3) {
    this->_quote = '\'';
    local_a0._size = 0;
    local_a0._len = 2;
    local_a0.field_2._space[2] = '\0';
    local_a0.field_2._0_2_ = 0x2727;
    String::assign(&this->_equote,local_a0.field_2._space,2);
    if (local_a0._size != 0) {
      free((void *)CONCAT53(local_a0.field_2._3_5_,
                            CONCAT12(local_a0.field_2._space[2],local_a0.field_2._0_2_)));
    }
    if ((this->_name)._size == 0) {
      paVar7 = &(this->_name).field_2;
    }
    else {
      paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_name).field_2._str;
    }
    pcVar4 = strrchr(paVar7->_space,0x2f);
    iVar12 = (int)paVar7;
    iVar11 = ((int)pcVar4 - iVar12) + 1;
    if (pcVar4 == (char *)0x0) {
      iVar11 = 0;
    }
    pcVar4 = strrchr(paVar7->_space,0x5c);
    i = ((int)pcVar4 - iVar12) + 1;
    if (pcVar4 == (char *)0x0) {
      i = 0;
    }
    if (i < iVar11) {
      i = iVar11;
    }
    if (i < 1) {
      i = 0;
    }
    pcVar4 = strrchr(paVar7->_space,0x2e);
    String::substring(&local_a0,&this->_name,i,-(uint)(pcVar4 == (char *)0x0) | (int)pcVar4 - iVar12
                     );
    pTVar5 = TextFile::operator<<(&this->_file,"@relation ");
    pTVar5 = TextFile::operator<<(pTVar5,&local_a0);
    TextFile::operator<<(pTVar5,"\n\n");
    lVar8 = (long)*(int *)&local_70->_a[-1].field_2;
    if (0 < lVar8) {
      uVar9 = lVar8 << 0x20;
      do {
        local_88 = (String *)0x100000000;
        local_80._space[0] = ':';
        local_80._space[1] = '\0';
        String::split((String *)&local_68,local_70->_a + (int)uVar9);
        if ((int)local_88 != 0) {
          free((void *)CONCAT62(local_80._2_6_,CONCAT11(local_80._space[1],local_80._space[0])));
        }
        cVar10 = 'n';
        if (*(int *)&local_68[-1].field_2 != 1) {
          if (local_68[1]._size == 0) {
            paVar7 = &local_68[1].field_2;
          }
          else {
            paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)local_68[1].field_2._str;
          }
          cVar10 = paVar7->_space[0];
        }
        if (((1 < *(int *)&local_68[-1].field_2) && (1 < local_68[1]._len)) &&
           (iVar11 = String::indexOf(local_68 + 1,'|',0), -1 < iVar11)) {
          cVar10 = 'c';
        }
        local_80._space[0] = '\0';
        local_88 = (String *)0x0;
        if (cVar10 == 'c') {
          pSVar6 = String::replaceme(local_68 + 1,'|',',');
          local_48._size = 0;
          local_48._len = 1;
          local_48.field_2._0_2_ = 0x7b;
          if (pSVar6->_size == 0) {
            paVar7 = &pSVar6->field_2;
          }
          else {
            paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)(pSVar6->field_2)._str;
          }
          String::append(&local_48,paVar7->_space,pSVar6->_len);
          local_a1 = '}';
          String::concat((String *)local_60,&local_48,&local_a1,1);
          pcVar4 = local_60 + 8;
          if (local_60._0_4_ != 0) {
            pcVar4 = (char *)local_60._8_8_;
          }
          String::assign((String *)&local_88,pcVar4,local_60._4_4_);
          if (local_60._0_4_ != 0) {
            free((void *)local_60._8_8_);
          }
          if (local_48._size != 0) {
            free((void *)CONCAT62(local_48.field_2._2_6_,local_48.field_2._0_2_));
          }
        }
        else {
          if (cVar10 == 's') {
            iVar11 = 6;
            pcVar4 = "string";
          }
          else {
            if (cVar10 != 'n') goto LAB_0013c7f7;
            iVar11 = 7;
            pcVar4 = "numeric";
          }
          String::assign((String *)&local_88,pcVar4,iVar11);
        }
LAB_0013c7f7:
        pTVar5 = TextFile::operator<<(&this->_file,"@attribute ");
        pTVar5 = TextFile::operator<<(pTVar5,local_68);
        local_60[0] = 0x20;
        pTVar5 = TextFile::operator<<(pTVar5,local_60);
        pTVar5 = TextFile::operator<<(pTVar5,(String *)&local_88);
        local_48._size._0_1_ = 10;
        TextFile::operator<<(pTVar5,(char *)&local_48);
        if ((int)local_88 != 0) {
          free((void *)CONCAT62(local_80._2_6_,CONCAT11(local_80._space[1],local_80._space[0])));
        }
        Array<asl::String>::~Array((Array<asl::String> *)&local_68);
        uVar1 = uVar9 + 1;
        uVar2 = uVar9 >> 0x20;
        uVar9 = uVar9 & 0xffffffff00000000 | uVar1 & 0xffffffff;
      } while ((int)uVar1 < (int)uVar2);
    }
    TextFile::operator<<(&this->_file,"\n@data\n");
  }
  else {
    local_80._space[0] = this->_separator;
    local_88 = (String *)0x100000000;
    local_80._space[1] = '\0';
    Array<asl::String>::join(&local_a0,&this->_columnNames,(String *)&local_88);
    if ((int)local_88 != 0) {
      free((void *)CONCAT62(local_80._2_6_,CONCAT11(local_80._space[1],local_80._space[0])));
    }
    TextFile::operator<<(&this->_file,&local_a0);
  }
  if (local_a0._size != 0) {
    free((void *)CONCAT53(local_a0.field_2._3_5_,
                          CONCAT12(local_a0.field_2._space[2],local_a0.field_2._0_2_)));
  }
  return this;
}

Assistant:

TabularDataFile& TabularDataFile::columns(const Array<String>& cols)
{
	if(_separator == '\0')
		_separator = ',';

	if(_columnNames.length() == 0)
	{
		_file.open(_name, File::WRITE);
		if(!_file)
		{
			return *this;
		}
		foreach(String& col, cols)
		{
			Array<String> parts = col.split(':');
			_columnNames << parts[0];
		}
	}
	if(_name.toLowerCase().endsWith(".arff"))
	{
		_quote = '\'';
		_equote = String::repeat(_quote, 2);
		int i1 = max(max(_name.lastIndexOf('/')+1, _name.lastIndexOf('\\')+1), 0);
		int i2 = _name.lastIndexOf('.');
		String rel = _name.substring(i1, i2);
		_file << "@relation " << rel << "\n\n";

		foreach(String& col, cols)
		{
			Array<String> parts = col.split(':');
			char typec = (parts.length()==1)? 'n' : parts[1][0];
			if(parts.length() > 1 && parts[1].length() > 1 && parts[1].contains('|'))
				typec = 'c';
			String type;
			switch(typec)
			{
			case 'n':
				type = "numeric";
				break;
			case 's':
				type = "string";
				break;
			case 'c':
				type = '{' + parts[1].replaceme('|', ',') + '}';
			}
			_file << "@attribute " << parts[0] << ' ' << type << '\n';
		}
		_file << "\n@data\n";
	}
	else
	{
		String header = _columnNames.join(_separator);
		_file << header;
	}
	return *this;
}